

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

Ivy_FraigMan_t * Ivy_FraigStart(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  Ivy_FraigSim_t *pIVar1;
  char *pcVar2;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pObj_00;
  Ivy_FraigSim_t **ppIVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  Ivy_FraigMan_t *pIVar8;
  Ivy_Man_t *pIVar9;
  char *__s;
  uint *puVar10;
  int *piVar11;
  Vec_Ptr_t *pVVar12;
  int iVar13;
  int iVar14;
  int i;
  int iVar15;
  Ivy_FraigSim_t *local_60;
  
  for (iVar14 = 0; iVar14 < pManAig->vObjs->nSize; iVar14 = iVar14 + 1) {
    pvVar7 = Vec_PtrEntry(pManAig->vObjs,iVar14);
    if ((pvVar7 != (void *)0x0) &&
       ((*(long *)((long)pvVar7 + 0x48) != 0 || (*(long *)((long)pvVar7 + 0x20) != 0)))) {
      __assert_fail("!pObj->pEquiv && !pObj->pFanout",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x233,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
    }
  }
  pIVar8 = (Ivy_FraigMan_t *)calloc(1,0x138);
  pIVar8->pParams = pParams;
  pIVar8->pManAig = pManAig;
  pIVar9 = Ivy_ManStartFrom(pManAig);
  pIVar8->pManFraig = pIVar9;
  iVar14 = pParams->nSimWords;
  pIVar8->nSimWords = iVar14;
  iVar15 = iVar14 * 4 + 0x20;
  __s = (char *)malloc((long)((pManAig->nCreated - pManAig->nDeleted) * iVar15));
  pIVar8->pSimWords = __s;
  local_60 = (Ivy_FraigSim_t *)0x0;
  memset(__s,0,(long)iVar15);
  iVar13 = 0;
  for (i = 0; i < pManAig->vObjs->nSize; i = i + 1) {
    pvVar7 = Vec_PtrEntry(pManAig->vObjs,i);
    if (pvVar7 != (void *)0x0) {
      pIVar1 = (Ivy_FraigSim_t *)(__s + iVar13 * iVar15);
      pcVar2 = __s + (long)(iVar13 * iVar15) + 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      if ((*(uint *)((long)pvVar7 + 8) & 0xf) - 7 < 0xfffffffe) {
        pIVar1->pFanin0 = (Ivy_FraigSim_t *)0x0;
        pIVar1->pFanin1 = (Ivy_FraigSim_t *)0x0;
        uVar4 = 0;
      }
      else {
        ppIVar3 = (Ivy_FraigSim_t **)(__s + (long)((iVar13 + -1) * iVar15) + 8);
        if (local_60 == (Ivy_FraigSim_t *)0x0) {
          local_60 = pIVar1;
          ppIVar3 = &pIVar8->pSimStart;
        }
        *ppIVar3 = pIVar1;
        pObj = *(Ivy_Obj_t **)((long)pvVar7 + 0x10);
        pIVar1->pFanin0 = *(Ivy_FraigSim_t **)(((ulong)pObj & 0xfffffffffffffffe) + 0x20);
        pObj_00 = *(Ivy_Obj_t **)((long)pvVar7 + 0x18);
        pIVar1->pFanin1 = *(Ivy_FraigSim_t **)(((ulong)pObj_00 & 0xfffffffffffffffe) + 0x20);
        iVar5 = Ivy_ObjFaninPhase(pObj);
        iVar6 = Ivy_ObjFaninPhase(pObj_00);
        uVar4 = *(uint *)((long)pvVar7 + 8) >> 7 & 1 | iVar5 * 4 + iVar6 * 2;
      }
      iVar13 = iVar13 + 1;
      pIVar1->Type = uVar4;
      *(Ivy_FraigSim_t **)((long)pvVar7 + 0x20) = pIVar1;
    }
  }
  if (iVar13 == pManAig->nCreated - pManAig->nDeleted) {
    iVar13 = ((pManAig->nObjs[1] >> 5) + 1) - (uint)((pManAig->nObjs[1] & 0x1fU) == 0);
    pIVar8->nPatWords = iVar13;
    puVar10 = (uint *)malloc((long)iVar13 << 2);
    pIVar8->pPatWords = puVar10;
    piVar11 = (int *)malloc((long)iVar14 << 7);
    pIVar8->pPatScores = piVar11;
    pVVar12 = Vec_PtrAlloc(100);
    pIVar8->vPiVars = pVVar12;
    srand(0xabcabc);
    return pIVar8;
  }
  __assert_fail("k == Ivy_ManObjNum(pManAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,599,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_FraigMan_t * Ivy_FraigStart( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, k, EntrySize;
    // clean the fanout representation
    Ivy_ManForEachObj( pManAig, pObj, i )
//        pObj->pEquiv = pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
        assert( !pObj->pEquiv && !pObj->pFanout );
    // allocat the fraiging manager
    p = ABC_ALLOC( Ivy_FraigMan_t, 1 );
    memset( p, 0, sizeof(Ivy_FraigMan_t) );
    p->pParams   = pParams;
    p->pManAig   = pManAig;
    p->pManFraig = Ivy_ManStartFrom( pManAig );
    // allocate simulation info
    p->nSimWords    = pParams->nSimWords;
//    p->pSimWords    = ABC_ALLOC( unsigned, Ivy_ManObjNum(pManAig) * p->nSimWords ); 
    EntrySize    = sizeof(Ivy_FraigSim_t) + sizeof(unsigned) * p->nSimWords;
    p->pSimWords = (char *)ABC_ALLOC( char, Ivy_ManObjNum(pManAig) * EntrySize ); 
    memset( p->pSimWords, 0, (size_t)EntrySize );
    k = 0;
    Ivy_ManForEachObj( pManAig, pObj, i )
    {
        pSims = (Ivy_FraigSim_t *)(p->pSimWords + EntrySize * k++);
        pSims->pNext = NULL;
        if ( Ivy_ObjIsNode(pObj) )
        {
            if ( p->pSimStart == NULL )
                p->pSimStart = pSims;
            else
                ((Ivy_FraigSim_t *)(p->pSimWords + EntrySize * (k-2)))->pNext = pSims;
            pSims->pFanin0 = Ivy_ObjSim( Ivy_ObjFanin0(pObj) );
            pSims->pFanin1 = Ivy_ObjSim( Ivy_ObjFanin1(pObj) );
            pSims->Type = (Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) << 2) | (Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj)) << 1) | pObj->fPhase;
        }
        else
        {
            pSims->pFanin0 = NULL;
            pSims->pFanin1 = NULL;
            pSims->Type = 0;
        }
        Ivy_ObjSetSim( pObj, pSims );
    }
    assert( k == Ivy_ManObjNum(pManAig) );
    // allocate storage for sim pattern
    p->nPatWords  = Ivy_BitWordNum( Ivy_ManPiNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->pPatScores = ABC_ALLOC( int, 32 * p->nSimWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // set random number generator
    srand( 0xABCABC );
    return p;
}